

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

bool readBytes(FILE *stream,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  int iVar1;
  reference __ptr;
  size_t sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  FILE *in_RDI;
  fpos_t pos;
  size_t len;
  fpos_t local_30;
  size_type local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  FILE *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  iVar1 = fgetpos(local_10,&local_30);
  if (iVar1 == 0) {
    __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_18,0);
    sVar2 = fread(__ptr,1,local_20,local_10);
    if (sVar2 == local_20) {
      local_1 = true;
    }
    else {
      fsetpos(local_10,&local_30);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readBytes(FILE* stream, std::vector<uint8_t>& value)
{
	size_t len = value.size();
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	if (fread(&value[0], 1, len, stream) != len)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	return true;
}